

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O0

void __thiscall t_program::t_program(t_program *this,string *path)

{
  t_scope *this_00;
  string local_68;
  string local_48;
  allocator local_25 [13];
  string *local_18;
  string *path_local;
  t_program *this_local;
  
  local_18 = path;
  path_local = (string *)this;
  t_doc::t_doc(&this->super_t_doc);
  (this->super_t_doc)._vptr_t_doc = (_func_int **)&PTR__t_program_00562a08;
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  std::__cxx11::string::string((string *)&this->name_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->out_path_,"./",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  this->out_path_is_absolute_ = false;
  std::__cxx11::string::string((string *)&this->namespace_);
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector(&this->includes_);
  std::__cxx11::string::string((string *)&this->include_prefix_);
  std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector(&this->typedefs_);
  std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector(&this->enums_);
  std::vector<t_const_*,_std::allocator<t_const_*>_>::vector(&this->consts_);
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector(&this->objects_);
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector(&this->structs_);
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector(&this->xceptions_);
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector(&this->services_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->namespaces_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::map(&this->namespace_annotations_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->cpp_includes_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->c_includes_);
  this->recursive_ = false;
  std::__cxx11::string::string((string *)&local_68,(string *)path);
  program_name(&local_48,&local_68);
  std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  this_00 = (t_scope *)operator_new(0x90);
  memset(this_00,0,0x90);
  t_scope::t_scope(this_00);
  this->scope_ = this_00;
  return;
}

Assistant:

t_program(std::string path) : path_(path), out_path_("./"), out_path_is_absolute_(false), recursive_(false) {
    name_ = program_name(path);
    scope_ = new t_scope();
  }